

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QConfFileCustomFormat>::reallocate
          (QMovableArrayOps<QConfFileCustomFormat> *this,qsizetype alloc,AllocationOption option)

{
  pair<QArrayData_*,_void_*> pVar1;
  
  pVar1 = QArrayData::reallocateUnaligned
                    (&((this->super_QGenericArrayOps<QConfFileCustomFormat>).
                       super_QArrayDataPointer<QConfFileCustomFormat>.d)->super_QArrayData,
                     (this->super_QGenericArrayOps<QConfFileCustomFormat>).
                     super_QArrayDataPointer<QConfFileCustomFormat>.ptr,0x30,alloc,option);
  if (pVar1.second != (void *)0x0) {
    (this->super_QGenericArrayOps<QConfFileCustomFormat>).
    super_QArrayDataPointer<QConfFileCustomFormat>.d = (Data *)pVar1.first;
    (this->super_QGenericArrayOps<QConfFileCustomFormat>).
    super_QArrayDataPointer<QConfFileCustomFormat>.ptr = (QConfFileCustomFormat *)pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }